

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItemGraphVisitor.cxx
# Opt level: O1

bool __thiscall
cmLinkItemGraphVisitor::LinkVisited
          (cmLinkItemGraphVisitor *this,cmLinkItem *depender,cmLinkItem *dependee)

{
  string *__a;
  string *__b;
  iterator iVar1;
  _Rb_tree_header *p_Var2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  link;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  __a = cmLinkItem::AsStr_abi_cxx11_(depender);
  __b = cmLinkItem::AsStr_abi_cxx11_(dependee);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_58,__a,__b);
  iVar1 = std::
          _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->VisitedLinks)._M_t,&local_58);
  p_Var2 = &(this->VisitedLinks)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar1._M_node == p_Var2) {
    std::
    _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string,std::__cxx11::string>const&>
              ((_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&this->VisitedLinks,&local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.second._M_dataplus._M_p != &local_58.second.field_2) {
    operator_delete(local_58.second._M_dataplus._M_p,
                    local_58.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.first._M_dataplus._M_p != &local_58.first.field_2) {
    operator_delete(local_58.first._M_dataplus._M_p,local_58.first.field_2._M_allocated_capacity + 1
                   );
  }
  return (_Rb_tree_header *)iVar1._M_node != p_Var2;
}

Assistant:

bool cmLinkItemGraphVisitor::LinkVisited(cmLinkItem const& depender,
                                         cmLinkItem const& dependee)
{
  auto const link = std::make_pair<>(depender.AsStr(), dependee.AsStr());

  bool const linkVisited =
    this->VisitedLinks.find(link) != this->VisitedLinks.cend();

  if (!linkVisited) {
    this->VisitedLinks.insert(link);
  }

  return linkVisited;
}